

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_schedule_sync.c
# Opt level: O3

log_policy_interface log_policy_schedule_sync_interface(void)

{
  return &log_policy_schedule_sync_interface::policy_interface_schedule;
}

Assistant:

log_policy_interface log_policy_schedule_sync_interface(void)
{
	static struct log_policy_schedule_impl_type log_policy_schedule_sync_impl_obj = {
		&log_policy_schedule_sync_lock,
		&log_policy_schedule_sync_execute,
		&log_policy_schedule_sync_unlock
	};

	static struct log_policy_interface_type policy_interface_schedule = {
		&log_policy_schedule_sync_create,
		&log_policy_schedule_sync_impl_obj,
		&log_policy_schedule_sync_destroy
	};

	return &policy_interface_schedule;
}